

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

iterator_range<llvm::DWARFDie::attribute_iterator> * __thiscall
llvm::DWARFDie::attributes
          (iterator_range<llvm::DWARFDie::attribute_iterator> *__return_storage_ptr__,DWARFDie *this
          )

{
  attribute_iterator x;
  attribute_iterator y;
  attribute_iterator local_d0;
  DWARFUnit *local_78;
  DWARFDebugInfoEntry *local_70;
  attribute_iterator local_68;
  DWARFDie *local_10;
  DWARFDie *this_local;
  
  local_78 = this->U;
  local_70 = this->Die;
  local_10 = this;
  attribute_iterator::attribute_iterator(&local_68,*this,false);
  attribute_iterator::attribute_iterator(&local_d0,*this,true);
  x.Die.Die = (DWARFDebugInfoEntry *)local_68.AttrValue.Offset;
  x.Die.U = (DWARFUnit *)local_68.Die.Die;
  x.AttrValue.Offset._0_4_ = local_68.AttrValue.ByteSize;
  x.AttrValue.Offset._4_2_ = local_68.AttrValue.Attr;
  x.AttrValue.Offset._6_2_ = local_68.AttrValue._14_2_;
  x.AttrValue._8_8_ = local_68.AttrValue.Value._0_8_;
  x.AttrValue.Value._0_8_ = local_68.AttrValue.Value.Value.field_0.uval;
  x.AttrValue.Value.Value.field_0 =
       (anon_union_8_3_82d75f4a_for_ValueType_0)local_68.AttrValue.Value.Value.data;
  x.AttrValue.Value.Value.data = (uint8_t *)local_68.AttrValue.Value.Value.SectionIndex;
  x.AttrValue.Value.Value.SectionIndex = (uint64_t)local_68.AttrValue.Value.U;
  x.AttrValue.Value.U = (DWARFUnit *)local_68.AttrValue.Value.C;
  x.AttrValue.Value.C = (DWARFContext *)local_68._80_8_;
  x._80_8_ = local_d0.Die.U;
  y.Die.Die = (DWARFDebugInfoEntry *)local_d0.AttrValue.Offset;
  y.Die.U = (DWARFUnit *)local_d0.Die.Die;
  y.AttrValue.Offset._0_4_ = local_d0.AttrValue.ByteSize;
  y.AttrValue.Offset._4_2_ = local_d0.AttrValue.Attr;
  y.AttrValue.Offset._6_2_ = local_d0.AttrValue._14_2_;
  y.AttrValue._8_8_ = local_d0.AttrValue.Value._0_8_;
  y.AttrValue.Value._0_8_ = local_d0.AttrValue.Value.Value.field_0.uval;
  y.AttrValue.Value.Value.field_0 =
       (anon_union_8_3_82d75f4a_for_ValueType_0)local_d0.AttrValue.Value.Value.data;
  y.AttrValue.Value.Value.data = (uint8_t *)local_d0.AttrValue.Value.Value.SectionIndex;
  y.AttrValue.Value.Value.SectionIndex = (uint64_t)local_d0.AttrValue.Value.U;
  y.AttrValue.Value.U = (DWARFUnit *)local_d0.AttrValue.Value.C;
  y.AttrValue.Value.C = (DWARFContext *)local_d0._80_8_;
  y._80_8_ = this;
  make_range<llvm::DWARFDie::attribute_iterator>(x,y);
  return __return_storage_ptr__;
}

Assistant:

iterator_range<DWARFDie::attribute_iterator> DWARFDie::attributes() const {
  return make_range(attribute_iterator(*this, false),
                    attribute_iterator(*this, true));
}